

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

LockProxy __thiscall CategoriesMutex::try_lock(CategoriesMutex *this,int category)

{
  LockStatus status;
  int in_EDX;
  CategoriesMutex *extraout_RDX;
  undefined4 in_register_00000034;
  CategoriesMutex *this_00;
  LockProxy LVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  int category_local;
  CategoriesMutex *this_local;
  
  this_00 = (CategoriesMutex *)CONCAT44(in_register_00000034,category);
  lock._M_device._4_4_ = in_EDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this_00->internal_);
  status = try_lock_unsafe(this_00,lock._M_device._4_4_);
  LockProxy::LockProxy((LockProxy *)this,this_00,status);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  LVar1.mutex_ = extraout_RDX;
  LVar1._0_8_ = this;
  return LVar1;
}

Assistant:

LockProxy try_lock(int category) {
        std::lock_guard lock(internal_);
        return LockProxy(*this, try_lock_unsafe(category));
    }